

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

int corpus_reset(void)

{
  int iVar1;
  lineiter_t *li;
  uint32 *in_RCX;
  uint32 *sf;
  char **path;
  char **in_R8;
  
  n_run = 0xffffffff;
  if (ctl_fp != (FILE *)0x0) {
    path = (char **)0x0;
    fseek((FILE *)ctl_fp,0,0);
    if (transcription_fp != (FILE *)0x0) {
      path = (char **)0x0;
      fseek((FILE *)transcription_fp,0,0);
    }
    li = lineiter_start_clean(ctl_fp);
    if (li == (lineiter_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
              ,0x1b2,"Must be at least one line in the control file\n");
      iVar1 = -1;
    }
    else {
      parse_ctl_line(li->buf,path,sf,in_RCX,in_R8);
      lineiter_free(li);
      corpus_set_interval(sv_n_skip,sv_run_len);
      iVar1 = 0;
    }
    return iVar1;
  }
  __assert_fail("ctl_fp",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                ,0x1a9,"int corpus_reset()");
}

Assistant:

int
corpus_reset()
{
    lineiter_t* li;
    n_run = UNTIL_EOF;

    assert(ctl_fp);
    fseek(ctl_fp, 0L, SEEK_SET);

    if (transcription_fp)
        fseek(transcription_fp, 0L, SEEK_SET);

    li = lineiter_start_clean(ctl_fp);

    if (li == NULL) {
	E_ERROR("Must be at least one line in the control file\n");
	return S3_ERROR;
    }

    parse_ctl_line(li->buf,
		   &next_ctl_path,
		   &next_ctl_sf,
		   &next_ctl_ef,
		   &next_ctl_utt_id);
    lineiter_free (li);


    corpus_set_interval(sv_n_skip, sv_run_len);

    return S3_SUCCESS;
}